

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

int AF_AActor_TraceBleedAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *target;
  int iVar1;
  int iVar2;
  bool bVar3;
  bool local_63;
  TAngle<double> local_60;
  TAngle<double> local_58;
  VMValue *local_50;
  double pitch;
  double angle;
  AActor *pAStack_38;
  int damage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1276,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1276,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAStack_38 = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (pAStack_38 != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)pAStack_38,AActor::RegistrationInfo.MyClass);
  }
  target = pAStack_38;
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1276,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1277,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\0') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1277,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar1 = *(int *)&defaultparam_local[iVar1].Array;
  iVar2 = (int)self + 2;
  angle._4_4_ = iVar1;
  if (ret_local._4_4_ <= iVar2) {
    self._0_4_ = iVar2;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1278,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar2].Count != '\x01') {
    self._0_4_ = iVar2;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1278,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pitch = (double)defaultparam_local[iVar2].Array;
  self._0_4_ = (int)self + 3;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1279,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[(int)self].Count != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1279,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_50 = defaultparam_local[(int)self].Array;
  TAngle<double>::TAngle(&local_58,pitch);
  TAngle<double>::TAngle(&local_60,(double)local_50);
  P_TraceBleed(iVar1,target,&local_58,&local_60);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleedAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_FLOAT(angle);
	PARAM_FLOAT(pitch);

	P_TraceBleed(damage, self, angle, pitch);
	return 0;
}